

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

bigint<26> * __thiscall bigint<26>::mul<13,13>(bigint<26> *this,bigint<13> *x,bigint<13> *y)

{
  digit *__s;
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  digit *pdVar5;
  ulong uVar6;
  uint uVar7;
  
  if ((x->len == 0) || ((long)y->len == 0)) {
    this->len = 0;
  }
  else {
    __s = this->digits;
    memset(__s,0,(long)y->len * 2);
    lVar2 = (long)x->len;
    if (0 < lVar2) {
      uVar1 = y->len;
      lVar4 = 0;
      pdVar5 = __s;
      do {
        uVar7 = 0;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            uVar7 = pdVar5[uVar6] + uVar7 + (uint)y->digits[uVar6] * (uint)x->digits[lVar4];
            pdVar5[uVar6] = (digit)uVar7;
            uVar7 = uVar7 >> 0x10;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        __s[lVar4 + (int)uVar1] = (digit)uVar7;
        lVar4 = lVar4 + 1;
        pdVar5 = pdVar5 + 1;
      } while (lVar4 != lVar2);
    }
    lVar2 = y->len + lVar2;
    iVar3 = (int)lVar2;
    this->len = iVar3;
    if (iVar3 != 0) {
      do {
        if (this->digits[lVar2 + -1] != 0) {
          return this;
        }
        lVar4 = lVar2 + -1;
        this->len = (int)lVar2 + -1;
        lVar2 = lVar4;
      } while (lVar4 != 0);
    }
  }
  return this;
}

Assistant:

bigint &mul(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        if(!x.len || !y.len) { len = 0; return *this; }
        memset(digits, 0, y.len*sizeof(digit));
        loopi(x.len)
        {
            dbldigit carry = 0;
            loopj(y.len)
            {
                carry += (dbldigit)x.digits[i] * (dbldigit)y.digits[j] + (dbldigit)digits[i+j];
                digits[i+j] = (digit)carry;
                carry >>= BI_DIGIT_BITS;
            }
            digits[i+y.len] = carry;
        }
        len = x.len + y.len;
        shrink();
        return *this;
    }